

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::GenerateSerializedSizeCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  int i;
  char *pcVar2;
  mapped_type *args_3;
  undefined1 local_90 [32];
  key_type local_70;
  _func_void_FieldDescriptor_ptr *local_50;
  long local_48;
  undefined1 local_40 [32];
  
  variables = &(this->super_FieldGeneratorBase).variables_;
  io::Printer::Print(printer,variables,"if ($has_property_check$) {\n");
  io::Printer::Indent(printer);
  pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
  if (*(once_flag **)(pFVar1 + 0x18) != (once_flag *)0x0) {
    local_50 = FieldDescriptor::TypeOnceInit;
    local_90._0_8_ = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x18),&local_50,(FieldDescriptor **)local_90);
  }
  i = GetFixedSize((uint)(byte)pFVar1[2]);
  if (i == -1) {
    io::Printer::Print(printer,variables,
                       "size += $tag_size$ + pb::CodedOutputStream.Compute$capitalized_type_name$Size($property_name$);\n"
                      );
  }
  else {
    local_50 = (_func_void_FieldDescriptor_ptr *)local_40;
    pcVar2 = FastInt32ToBufferLeft(i,local_40);
    local_48 = (long)pcVar2 - (long)local_40;
    local_90._0_8_ = (FieldDescriptor *)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,local_50,local_50 + local_48)
    ;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"tag_size","");
    args_3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_70);
    io::Printer::Print<char[11],std::__cxx11::string,char[9],std::__cxx11::string>
              (printer,"size += $tag_size$ + $fixed_size$;\n",(char (*) [11])"fixed_size",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [9])"tag_size",args_3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_90._0_8_ != (FieldDescriptor *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void PrimitiveFieldGenerator::GenerateSerializedSizeCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n");
  printer->Indent();
  int fixedSize = GetFixedSize(descriptor_->type());
  if (fixedSize == -1) {
    printer->Print(
      variables_,
      "size += $tag_size$ + pb::CodedOutputStream.Compute$capitalized_type_name$Size($property_name$);\n");
  } else {
    printer->Print(
      "size += $tag_size$ + $fixed_size$;\n",
      "fixed_size", StrCat(fixedSize),
      "tag_size", variables_["tag_size"]);
  }
  printer->Outdent();
  printer->Print("}\n");
}